

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Chapter::ExpandDisplaysArray(Chapter *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long in_RDI;
  int idx;
  Display *displays;
  int size;
  void *local_50;
  int local_44;
  int local_38;
  bool local_1;
  
  if (*(int *)(in_RDI + 0x2c) < *(int *)(in_RDI + 0x28)) {
    local_1 = true;
  }
  else {
    if (*(int *)(in_RDI + 0x28) == 0) {
      local_44 = 1;
    }
    else {
      local_44 = *(int *)(in_RDI + 0x28) << 1;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)local_44;
    uVar2 = SUB168(auVar1 * ZEXT816(0x18),0);
    if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2,(nothrow_t *)&std::nothrow);
    local_50 = (void *)0x0;
    if (pvVar3 != (void *)0x0) {
      local_50 = pvVar3;
    }
    if (local_50 == (void *)0x0) {
      local_1 = false;
    }
    else {
      for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x2c); local_38 = local_38 + 1) {
        puVar5 = (undefined8 *)(*(long *)(in_RDI + 0x20) + (long)local_38 * 0x18);
        puVar4 = (undefined8 *)((long)local_50 + (long)local_38 * 0x18);
        *puVar4 = *puVar5;
        puVar4[1] = puVar5[1];
        puVar4[2] = puVar5[2];
      }
      if (*(void **)(in_RDI + 0x20) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 0x20));
      }
      *(void **)(in_RDI + 0x20) = local_50;
      *(int *)(in_RDI + 0x28) = local_44;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Chapter::ExpandDisplaysArray() {
  if (displays_size_ > displays_count_)
    return true;  // nothing to do yet

  const int size = (displays_size_ == 0) ? 1 : 2 * displays_size_;

  Display* const displays = new (std::nothrow) Display[size];  // NOLINT
  if (displays == NULL)
    return false;

  for (int idx = 0; idx < displays_count_; ++idx) {
    displays[idx] = displays_[idx];  // shallow copy
  }

  delete[] displays_;

  displays_ = displays;
  displays_size_ = size;

  return true;
}